

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::TParseContext::constructorTextureSamplerError
          (TParseContext *this,TSourceLoc *loc,TFunction *function)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  long lVar5;
  TSampler *pTVar6;
  long *plVar7;
  ulong uVar8;
  bool local_79;
  TSampler local_70;
  undefined4 local_6c;
  TSampler texture;
  bool bindlessMode;
  bool isIntegerVec2;
  TBasicType basicType;
  TType *pType;
  char *token;
  TString constructorName;
  TFunction *function_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  constructorName.field_2._8_8_ = function;
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])();
  TType::getBasicTypeString_abi_cxx11_((TString *)&token,(TType *)CONCAT44(extraout_var,iVar2));
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   &token);
  iVar2 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x120))();
  if (iVar2 == 1) {
    lVar5 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x140))
                      (constructorName.field_2._8_8_,0);
    plVar7 = *(long **)(lVar5 + 8);
    iVar2 = (**(code **)(*plVar7 + 0x38))();
    if ((iVar2 == 9) || (local_79 = false, iVar2 == 8)) {
      iVar2 = (**(code **)(*plVar7 + 0x60))();
      local_79 = iVar2 == 2;
    }
    texture._3_1_ = local_79;
    uVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_ARB_bindless_texture");
    texture._2_1_ = (byte)uVar3 & 1;
    if (((texture._3_1_ & 1) == 0) || ((uVar3 & 1) == 0)) {
      if ((uVar3 & 1) == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "sampler-constructor requires the extension GL_ARB_bindless_texture enabled",
                   pcVar4,"");
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"sampler-constructor requires the input to be ivec2 or uvec2",pcVar4,"")
        ;
      }
      this_local._7_1_ = true;
    }
    else {
      pTVar6 = (TSampler *)(**(code **)(*plVar7 + 0x48))();
      bVar1 = TSampler::isImage(pTVar6);
      if (bVar1) {
        TIntermediate::setBindlessImageMode
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                   &this->currentCaller,AstRefTypeFunc);
      }
      else {
        TIntermediate::setBindlessTextureMode
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                   &this->currentCaller,AstRefTypeFunc);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    iVar2 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x120))();
    if (iVar2 == 2) {
      plVar7 = (long *)(**(code **)(*(long *)constructorName.field_2._8_8_ + 0x60))();
      uVar8 = (**(code **)(*plVar7 + 0xe8))();
      if ((uVar8 & 1) == 0) {
        lVar5 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x140))();
        iVar2 = (**(code **)(**(long **)(lVar5 + 8) + 0x38))();
        if (iVar2 == 0xe) {
          lVar5 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x140))();
          pTVar6 = (TSampler *)(**(code **)(**(long **)(lVar5 + 8) + 0x48))();
          bVar1 = TSampler::isTexture(pTVar6);
          if (bVar1) {
            lVar5 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x140))();
            uVar8 = (**(code **)(**(long **)(lVar5 + 8) + 0xe8))();
            if ((uVar8 & 1) == 0) {
              plVar7 = (long *)(**(code **)(*(long *)constructorName.field_2._8_8_ + 0x60))();
              pTVar6 = (TSampler *)(**(code **)(*plVar7 + 0x40))();
              local_70 = *pTVar6;
              TSampler::setCombined(&local_70,false);
              local_70 = (TSampler)((uint)local_70 & 0xfffdffff);
              lVar5 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x140))
                                (constructorName.field_2._8_8_,0);
              pTVar6 = (TSampler *)(**(code **)(**(long **)(lVar5 + 8) + 0x48))();
              bVar1 = TSampler::operator!=(&local_70,pTVar6);
              if (bVar1) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,
                           "sampler-constructor first argument must be a *texture* type matching the dimensionality and sampled type of the constructor"
                           ,pcVar4,"");
                this_local._7_1_ = true;
              }
              else {
                lVar5 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x140))
                                  (constructorName.field_2._8_8_,1);
                iVar2 = (**(code **)(**(long **)(lVar5 + 8) + 0x38))();
                if (iVar2 == 0xe) {
                  lVar5 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x140))
                                    (constructorName.field_2._8_8_,1);
                  pTVar6 = (TSampler *)(**(code **)(**(long **)(lVar5 + 8) + 0x48))();
                  bVar1 = TSampler::isPureSampler(pTVar6);
                  if (bVar1) {
                    lVar5 = (**(code **)(*(long *)constructorName.field_2._8_8_ + 0x140))
                                      (constructorName.field_2._8_8_,1);
                    uVar8 = (**(code **)(**(long **)(lVar5 + 8) + 0xe8))();
                    if ((uVar8 & 1) == 0) {
                      this_local._7_1_ = false;
                      goto LAB_00760ca1;
                    }
                  }
                }
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,loc,
                           "sampler-constructor second argument must be a scalar sampler or samplerShadow"
                           ,pcVar4,"");
                this_local._7_1_ = true;
              }
              goto LAB_00760ca1;
            }
          }
        }
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"sampler-constructor first argument must be a scalar *texture* type",
                   pcVar4,"");
        this_local._7_1_ = true;
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"sampler-constructor cannot make an array of samplers",pcVar4,"");
        this_local._7_1_ = true;
      }
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"sampler-constructor requires two arguments",pcVar4,"");
      this_local._7_1_ = true;
    }
  }
LAB_00760ca1:
  local_6c = 1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&token
               );
  return this_local._7_1_;
}

Assistant:

bool TParseContext::constructorTextureSamplerError(const TSourceLoc& loc, const TFunction& function)
{
    TString constructorName = function.getType().getBasicTypeString();  // TODO: performance: should not be making copy; interface needs to change
    const char* token = constructorName.c_str();
    // verify the constructor for bindless texture, the input must be ivec2 or uvec2
    if (function.getParamCount() == 1) {
        TType* pType = function[0].type;
        TBasicType basicType = pType->getBasicType();
        bool isIntegerVec2 = ((basicType == EbtUint || basicType == EbtInt) && pType->getVectorSize() == 2);
        bool bindlessMode = extensionTurnedOn(E_GL_ARB_bindless_texture);
        if (isIntegerVec2 && bindlessMode) {
            if (pType->getSampler().isImage())
                intermediate.setBindlessImageMode(currentCaller, AstRefTypeFunc);
            else
                intermediate.setBindlessTextureMode(currentCaller, AstRefTypeFunc);
            return false;
        } else {
            if (!bindlessMode)
                error(loc, "sampler-constructor requires the extension GL_ARB_bindless_texture enabled", token, "");
            else
                error(loc, "sampler-constructor requires the input to be ivec2 or uvec2", token, "");
            return true;
        }
    }

    // exactly two arguments needed
    if (function.getParamCount() != 2) {
        error(loc, "sampler-constructor requires two arguments", token, "");
        return true;
    }

    // For now, not allowing arrayed constructors, the rest of this function
    // is set up to allow them, if this test is removed:
    if (function.getType().isArray()) {
        error(loc, "sampler-constructor cannot make an array of samplers", token, "");
        return true;
    }

    // first argument
    //  * the constructor's first argument must be a texture type
    //  * the dimensionality (1D, 2D, 3D, Cube, Rect, Buffer, MS, and Array)
    //    of the texture type must match that of the constructed sampler type
    //    (that is, the suffixes of the type of the first argument and the
    //    type of the constructor will be spelled the same way)
    if (function[0].type->getBasicType() != EbtSampler ||
        ! function[0].type->getSampler().isTexture() ||
        function[0].type->isArray()) {
        error(loc, "sampler-constructor first argument must be a scalar *texture* type", token, "");
        return true;
    }
    // simulate the first argument's impact on the result type, so it can be compared with the encapsulated operator!=()
    TSampler texture = function.getType().getSampler();
    texture.setCombined(false);
    texture.shadow = false;
    if (texture != function[0].type->getSampler()) {
        error(loc, "sampler-constructor first argument must be a *texture* type"
                   " matching the dimensionality and sampled type of the constructor", token, "");
        return true;
    }

    // second argument
    //   * the constructor's second argument must be a scalar of type
    //     *sampler* or *samplerShadow*
    if (  function[1].type->getBasicType() != EbtSampler ||
        ! function[1].type->getSampler().isPureSampler() ||
          function[1].type->isArray()) {
        error(loc, "sampler-constructor second argument must be a scalar sampler or samplerShadow", token, "");
        return true;
    }

    return false;
}